

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_str2addr(char *str,char **endp,sockaddr_can *can)

{
  int iVar1;
  size_t sVar2;
  ulonglong uVar3;
  ulong uVar4;
  undefined2 *in_RDX;
  char **in_RSI;
  char *in_RDI;
  char tmp_1 [16];
  unsigned_long tmp;
  uint64_t tmp64;
  char *pstr;
  char *p;
  char local_58 [16];
  char *in_stack_ffffffffffffffb8;
  char *local_30;
  char *local_28;
  undefined2 *local_20;
  char **local_18;
  char *local_10;
  
  local_18 = in_RSI;
  if (in_RSI == (char **)0x0) {
    local_18 = &local_28;
  }
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(in_RDX,0,0x18);
  *local_20 = 0x1d;
  *(undefined8 *)(local_20 + 4) = 0;
  *(undefined1 *)(local_20 + 10) = 0xff;
  *(undefined4 *)(local_20 + 8) = 0x40000;
  local_30 = strchr(local_10,0x3a);
  if (local_30 == (char *)0x0) {
    iVar1 = libj1939_ifindex(in_stack_ffffffffffffffb8);
    *(int *)(local_20 + 2) = iVar1;
    if (*(int *)(local_20 + 2) != 0) {
      if (local_18 != (char **)0x0) {
        sVar2 = strlen(local_10);
        *local_18 = local_10 + sVar2;
      }
      return 0;
    }
  }
  else {
    if (0xf < (long)local_30 - (long)local_10) {
      return -1;
    }
    strncpy(local_58,local_10,(long)local_30 - (long)local_10);
    local_30[(long)(local_58 + -(long)local_10)] = '\0';
    iVar1 = libj1939_ifindex(in_stack_ffffffffffffffb8);
    *(int *)(local_20 + 2) = iVar1;
  }
  if (local_30 == (char *)0x0) {
    local_30 = local_10;
  }
  else {
    local_30 = local_30 + 1;
  }
  uVar3 = strtoull(local_30,local_18,0x10);
  if (local_30 < *local_18) {
    if ((long)*local_18 - (long)local_30 == 2) {
      *(char *)(local_20 + 10) = (char)uVar3;
    }
    else {
      *(ulonglong *)(local_20 + 4) = uVar3;
    }
    if (**local_18 != '\0') {
      local_10 = *local_18 + 1;
      uVar4 = strtoul(local_10,local_18,0x10);
      if (local_10 < *local_18) {
        *(int *)(local_20 + 8) = (int)uVar4;
      }
    }
  }
  return 0;
}

Assistant:

int libj1939_str2addr(const char *str, char **endp, struct sockaddr_can *can)
{
	char *p;
	const char *pstr;
	uint64_t tmp64;
	unsigned long tmp;

	if (!endp)
		endp = &p;
	memset(can, 0, sizeof(*can));
	can->can_family = AF_CAN;
	can->can_addr.j1939.name = J1939_NO_NAME;
	can->can_addr.j1939.addr = J1939_NO_ADDR;
	can->can_addr.j1939.pgn = J1939_NO_PGN;

	pstr = strchr(str, ':');
	if (pstr) {
		char tmp[IFNAMSIZ];
		if ((pstr - str) >= IFNAMSIZ)
			return -1;
		strncpy(tmp, str, pstr - str);
		tmp[pstr - str] = 0;
		can->can_ifindex = libj1939_ifindex(tmp);
	} else {
		can->can_ifindex = libj1939_ifindex(str);
		if (can->can_ifindex) {
			if (endp)
				*endp = (char *)&str[strlen(str)];
			return 0;
		}
	}
	if (pstr)
		++pstr;
	else
		pstr = str;


	tmp64 = strtoull(pstr, endp, 16);
	if (*endp <= pstr)
		return 0;
	if ((*endp - pstr) == 2)
		can->can_addr.j1939.addr = tmp64;
	else
		can->can_addr.j1939.name = tmp64;
	if (!**endp)
		return 0;

	str = *endp + 1;
	tmp = strtoul(str, endp, 16);
	if (*endp > str)
		can->can_addr.j1939.pgn = tmp;
	return 0;
}